

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  TDrawFunction TVar2;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  undefined1 auVar3 [16];
  GLuint GVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *this_01;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  CColorArray coords;
  CElementArray elements;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferTest;
  CColorArray bufferRef;
  GLchar *varyings [1];
  DIResult result;
  undefined1 local_3d8 [16];
  pointer local_3c8;
  string local_3b8;
  undefined1 local_398 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_380;
  undefined4 local_368;
  undefined1 auStack_364 [12];
  undefined4 local_358;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_348;
  char *local_330;
  undefined1 local_328 [4];
  undefined1 auStack_324 [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [23];
  long local_1a8;
  undefined1 local_1a0 [384];
  
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen
            ((DrawIndirectBase *)this,4,(this->super_CBasicXFBPausedDef)._drawSizeX,
             (this->super_CBasicXFBPausedDef)._drawSizeY,(CColorArray *)local_3d8);
  local_318[0]._M_allocated_capacity = 0x6e6f697372657623;
  local_318[0]._8_4_ = 0x30303420;
  auStack_324._4_8_ = (_func_int **)0xc;
  local_318[0]._M_local_buf[0xc] = '\0';
  _local_328 = (pointer)local_318;
  plVar7 = (long *)std::__cxx11::string::append(local_328);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_1a0._16_8_ = *psVar9;
    local_1a0._24_8_ = plVar7[3];
    local_1a0._0_8_ = local_1a0 + 0x10;
  }
  else {
    local_1a0._16_8_ = *psVar9;
    local_1a0._0_8_ = (size_type *)*plVar7;
  }
  local_1a0._8_8_ = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_328 != local_318) {
    operator_delete(_local_328,local_318[0]._M_allocated_capacity + 1);
  }
  auStack_324._4_4_ = 0.0;
  auStack_324._8_4_ = 0.0;
  _local_328 = (pointer)local_318;
  local_318[0]._M_allocated_capacity = local_318[0]._M_allocated_capacity & 0xffffffffffffff00;
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar4 = DrawIndirectBase::CreateProgram
                    ((DrawIndirectBase *)this,(string *)local_1a0,(string *)local_328,&local_3b8,
                     false);
  (this->super_CBasicXFBPausedDef)._program = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_328 != local_318) {
    operator_delete(_local_328,local_318[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_330 = "dataOut";
  this_00 = &(this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (this_00,(this->super_CBasicXFBPausedDef)._program,1,&local_330,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
  lVar8 = DrawIndirectBase::CheckProgram
                    ((DrawIndirectBase *)this,(this->super_CBasicXFBPausedDef)._program);
  if (lVar8 == 0) {
    lVar8 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*pGVar1);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_3d8._8_8_ - local_3d8._0_8_,(void *)local_3d8._0_8_,0x88e4);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindVertexArray(this_00,*pGVar1);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_398 = (undefined1  [16])0x0;
    local_358 = 0;
    local_368 = 0;
    auStack_364 = SUB1612((undefined1  [16])0x0,4);
    auVar3._12_4_ = 0;
    auVar3._0_12_ = auStack_324;
    _local_328 = (float  [4])(auVar3 << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b8,
               (long)(local_3d8._8_8_ - local_3d8._0_8_) >> 4,(value_type_conflict4 *)local_328,
               (allocator_type *)local_1a0);
    auVar3 = _DAT_019f5ce0;
    if (local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p != 0) {
      lVar8 = (long)(local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p) >> 2;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar10 = lVar8 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_019f5ce0;
      auVar13 = _DAT_019fcc00;
      do {
        auVar14 = auVar13 ^ auVar3;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(int *)(local_3b8._M_dataplus._M_p + uVar11 * 4) = (int)uVar11;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          *(int *)(local_3b8._M_dataplus._M_p + uVar11 * 4 + 4) = (int)uVar11 + 1;
        }
        uVar11 = uVar11 + 2;
        lVar10 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar10 + 2;
      } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar11);
    }
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfo;
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,*pGVar1);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar1);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glPauseTransformFeedback(this_00);
    TVar2 = (this->super_CBasicXFBPausedDef)._drawFunc;
    if (TVar2 == DRAW_ARRAYS) {
      local_398._4_8_ = 1;
      local_398._0_4_ = (int)((ulong)(local_3d8._8_8_ - local_3d8._0_8_) >> 4);
      local_398._12_4_ = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,(GLuint)local_328);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,local_398,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    else {
      if (TVar2 != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_368 = (undefined4)((ulong)(local_3d8._8_8_ - local_3d8._0_8_) >> 4);
      auStack_364 = SUB1612(ZEXT416(1),0);
      local_358 = 0;
      pGVar1 = &(this->super_CBasicXFBPausedDef)._ebo;
      glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,*pGVar1);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p,
                 local_3b8._M_dataplus._M_p,0x88e4);
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,(GLuint)local_328);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_368,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    glu::CallLogWrapper::glResumeTransformFeedback(this_00);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
    iVar6 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    auStack_324._4_4_ = 0.3;
    auStack_324._8_4_ = 1.0;
    local_328 = (undefined1  [4])0x3dcccccd;
    auStack_324._0_4_ = 0.2;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_348,(long)(iVar5 * *(int *)(CONCAT44(extraout_var_00,iVar6) + 4)),
               (value_type *)local_328,(allocator_type *)local_1a0);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_01,iVar5);
    iVar6 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    local_328 = (undefined1  [4])0x0;
    auStack_324._0_4_ = 0.0;
    auStack_324._4_4_ = 0.0;
    auStack_324._8_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_380,(long)(iVar5 * *(int *)(CONCAT44(extraout_var_02,iVar6) + 4)),
               (value_type *)local_328,(allocator_type *)local_1a0);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_03,iVar5);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar5) + 4),0x1908,0x1406,
               local_380.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    auVar14[0xf] = 0;
    auVar14._0_15_ = stack0xfffffffffffffcd9;
    _local_328 = (float  [4])(auVar14 << 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_324 + 4));
    local_1a8 = 0;
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar5);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar5) + 4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar5);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
                        super_GLWrapper.m_context)->m_renderCtx,&local_380,widthTest,heightTest,
                       &local_348,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar5) + 4));
    DIResult::sub_result((DILogger *)local_1a0,(DIResult *)local_328,lVar8);
    DILogger::~DILogger((DILogger *)local_1a0);
    lVar8 = local_1a8;
    DILogger::~DILogger((DILogger *)local_328);
    if (local_380.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_380.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_380.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_380.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
    }
  }
  if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3d8._0_8_,(long)local_3c8 - local_3d8._0_8_);
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		return CBasicXFBPausedDef::Run<api>();
	}